

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

void order_update(sat_solver2 *s,int v)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int *piVar4;
  int local_34;
  int parent;
  int x;
  int i;
  int *heap;
  int *orderpos;
  int v_local;
  sat_solver2 *s_local;
  
  piVar2 = s->orderpos;
  piVar4 = veci_begin(&s->order);
  parent = piVar2[v];
  iVar1 = piVar4[parent];
  if (s->orderpos[v] == -1) {
    __assert_fail("s->orderpos[v] != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0xf2,"void order_update(sat_solver2 *, int)");
  }
  while( true ) {
    local_34 = (parent + -1) / 2;
    bVar3 = false;
    if (parent != 0) {
      bVar3 = s->activity[piVar4[local_34]] < s->activity[iVar1];
    }
    if (!bVar3) break;
    piVar4[parent] = piVar4[local_34];
    piVar2[piVar4[parent]] = parent;
    parent = local_34;
  }
  piVar4[parent] = iVar1;
  piVar2[iVar1] = parent;
  return;
}

Assistant:

static inline void order_update(sat_solver2* s, int v) // updateorder
{
    int*      orderpos = s->orderpos;
    int*      heap     = veci_begin(&s->order);
    int       i        = orderpos[v];
    int       x        = heap[i];
    int       parent   = (i - 1) / 2;
    assert(s->orderpos[v] != -1);
    while (i != 0 && s->activity[x] > s->activity[heap[parent]]){
        heap[i]           = heap[parent];
        orderpos[heap[i]] = i;
        i                 = parent;
        parent            = (i - 1) / 2;
    }
    heap[i]     = x;
    orderpos[x] = i;
}